

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O0

bool wallet::ScriptIsChange(CWallet *wallet,CScript *script)

{
  bool bVar1;
  isminetype iVar2;
  CAddressBookData *pCVar3;
  CWallet *in_RSI;
  long in_FS_OFFSET;
  CScript *in_stack_00000048;
  CTxDestination address;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  char *in_stack_ffffffffffffff68;
  undefined1 allow_change;
  undefined7 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int iVar4;
  undefined4 in_stack_ffffffffffffff84;
  CScript *in_stack_ffffffffffffff88;
  byte local_59;
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            (in_stack_ffffffffffffff68,
             (char *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff5c,(AnnotatedMixin<std::recursive_mutex> *)0x39498a);
  iVar2 = CWallet::IsMine(in_RSI,in_stack_ffffffffffffff88);
  if (iVar2 != ISMINE_NO) {
    allow_change = (undefined1)((ulong)local_58 >> 0x38);
    std::
    variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    bVar1 = ExtractDestination(in_stack_00000048,(CTxDestination *)wallet);
    if (bVar1) {
      pCVar3 = CWallet::FindAddressBookEntry
                         ((CWallet *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          (CTxDestination *)CONCAT17(bVar1,in_stack_ffffffffffffff78),
                          (bool)allow_change);
      if (pCVar3 == (CAddressBookData *)0x0) {
        local_59 = 1;
        iVar4 = 1;
      }
      else {
        iVar4 = 0;
      }
    }
    else {
      local_59 = 1;
      iVar4 = 1;
    }
    std::
    variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (iVar4 != 0) goto LAB_00394a57;
  }
  local_59 = 0;
LAB_00394a57:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_59 & 1);
}

Assistant:

bool ScriptIsChange(const CWallet& wallet, const CScript& script)
{
    // TODO: fix handling of 'change' outputs. The assumption is that any
    // payment to a script that is ours, but is not in the address book
    // is change. That assumption is likely to break when we implement multisignature
    // wallets that return change back into a multi-signature-protected address;
    // a better way of identifying which outputs are 'the send' and which are
    // 'the change' will need to be implemented (maybe extend CWalletTx to remember
    // which output, if any, was change).
    AssertLockHeld(wallet.cs_wallet);
    if (wallet.IsMine(script))
    {
        CTxDestination address;
        if (!ExtractDestination(script, address))
            return true;
        if (!wallet.FindAddressBookEntry(address)) {
            return true;
        }
    }
    return false;
}